

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O2

char * google::protobuf::compiler::cpp::PrimitiveTypeName(CppType type)

{
  LogMessage *pLVar1;
  char *pcVar2;
  LogFinisher local_41;
  LogMessage local_40 [56];
  
  if (type - CPPTYPE_INT32 < 10) {
    pcVar2 = (&PTR_anon_var_dwarf_62da9_0019ac68)[type - CPPTYPE_INT32];
  }
  else {
    google::protobuf::internal::LogMessage::LogMessage
              (local_40,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0xe1);
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<(local_40,"Can\'t get here.");
    google::protobuf::internal::LogFinisher::operator=(&local_41,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(local_40);
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char* PrimitiveTypeName(FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32  : return "::google::protobuf::int32";
    case FieldDescriptor::CPPTYPE_INT64  : return "::google::protobuf::int64";
    case FieldDescriptor::CPPTYPE_UINT32 : return "::google::protobuf::uint32";
    case FieldDescriptor::CPPTYPE_UINT64 : return "::google::protobuf::uint64";
    case FieldDescriptor::CPPTYPE_DOUBLE : return "double";
    case FieldDescriptor::CPPTYPE_FLOAT  : return "float";
    case FieldDescriptor::CPPTYPE_BOOL   : return "bool";
    case FieldDescriptor::CPPTYPE_ENUM   : return "int";
    case FieldDescriptor::CPPTYPE_STRING : return "::std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE: return NULL;

    // No default because we want the compiler to complain if any new
    // CppTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return NULL;
}